

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeoffsets.cpp
# Opt level: O1

void __thiscall TimeOffsets::Add(TimeOffsets *this,seconds offset)

{
  long lVar1;
  _Map_pointer ppdVar2;
  _Elt_pointer pdVar3;
  bool bVar4;
  Logger *this_00;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  unsigned_long local_40;
  rep local_38;
  seconds offset_local;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  criticalblock0.super_unique_lock._M_owns = false;
  offset_local = offset;
  criticalblock0.super_unique_lock._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&criticalblock0.super_unique_lock);
  ppdVar2 = (this->m_offsets).
            super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
            ._M_impl.super__Deque_impl_data._M_finish._M_node;
  if (0x31 < ((long)(this->m_offsets).
                    super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_last -
              (long)(this->m_offsets).
                    super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
             ((long)(this->m_offsets).
                    super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_cur -
              (long)(this->m_offsets).
                    super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
             ((((ulong)((long)ppdVar2 -
                       (long)(this->m_offsets).
                             super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
             (ulong)(ppdVar2 == (_Map_pointer)0x0)) * 0x40) {
    std::
    deque<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ::pop_front(&this->m_offsets);
  }
  pdVar3 = (this->m_offsets).
           super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
           ._M_impl.super__Deque_impl_data._M_finish._M_cur;
  if (pdVar3 == (this->m_offsets).
                super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
    std::
    deque<std::chrono::duration<long,std::ratio<1l,1l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1l>>>>
    ::_M_push_back_aux<std::chrono::duration<long,std::ratio<1l,1l>>const&>
              ((deque<std::chrono::duration<long,std::ratio<1l,1l>>,std::allocator<std::chrono::duration<long,std::ratio<1l,1l>>>>
                *)&this->m_offsets,&offset_local);
  }
  else {
    pdVar3->__r = offset_local.__r;
    (this->m_offsets).
    super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
    ._M_impl.super__Deque_impl_data._M_finish._M_cur = pdVar3 + 1;
  }
  this_00 = LogInstance();
  bVar4 = BCLog::Logger::WillLogCategoryLevel(this_00,NET,Debug);
  if (bVar4) {
    local_38 = offset_local.__r;
    ppdVar2 = (this->m_offsets).
              super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node;
    local_40 = ((long)(this->m_offsets).
                      super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_last -
                (long)(this->m_offsets).
                      super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur >> 3) +
               ((long)(this->m_offsets).
                      super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_cur -
                (long)(this->m_offsets).
                      super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first >> 3) +
               ((((ulong)((long)ppdVar2 -
                         (long)(this->m_offsets).
                               super__Deque_base<std::chrono::duration<long,_std::ratio<1L,_1L>_>,_std::allocator<std::chrono::duration<long,_std::ratio<1L,_1L>_>_>_>
                               ._M_impl.super__Deque_impl_data._M_start._M_node) >> 3) - 1) +
               (ulong)(ppdVar2 == (_Map_pointer)0x0)) * 0x40;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/timeoffsets.cpp"
    ;
    source_file._M_len = 100;
    logging_function._M_str = "Add";
    logging_function._M_len = 3;
    LogPrintFormatInternal<long,unsigned_long>
              (logging_function,source_file,0x1f,NET,Debug,(ConstevalFormatString<2U>)0xfb8b95,
               &local_38,&local_40);
  }
  std::unique_lock<std::mutex>::~unique_lock(&criticalblock0.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TimeOffsets::Add(std::chrono::seconds offset)
{
    LOCK(m_mutex);

    if (m_offsets.size() >= MAX_SIZE) {
        m_offsets.pop_front();
    }
    m_offsets.push_back(offset);
    LogDebug(BCLog::NET, "Added time offset %+ds, total samples %d\n",
             Ticks<std::chrono::seconds>(offset), m_offsets.size());
}